

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# collection.cpp
# Opt level: O3

convertable * __thiscall
mpt::node_relation::find(node_relation *this,type_t type,char *name,int nlen)

{
  convertable *pcVar1;
  relation *prVar2;
  bool bVar3;
  int iVar4;
  size_t sVar5;
  undefined4 extraout_var;
  node *pnVar6;
  
  pnVar6 = this->_curr;
  if (pnVar6 != (node *)0x0) {
    sVar5 = (size_t)(uint)nlen;
    if (nlen < 0) {
      if (name == (char *)0x0) {
        sVar5 = 0;
      }
      else {
        sVar5 = strlen(name);
      }
    }
    for (pnVar6 = pnVar6->children; pnVar6 != (node *)0x0; pnVar6 = pnVar6->next) {
      pcVar1 = &pnVar6->_meta->super_convertable;
      if ((pcVar1 != (convertable *)0x0) &&
         ((name == (char *)0x0 || (bVar3 = identifier::equal(&pnVar6->ident,name,(int)sVar5), bVar3)
          ))) {
        if (type == 0) {
          return pcVar1;
        }
        iVar4 = (**pcVar1->_vptr_convertable)(pcVar1,type,0);
        if (-1 < iVar4) {
          return pcVar1;
        }
      }
    }
    prVar2 = this->_parent;
    if (prVar2 != (relation *)0x0) {
      iVar4 = (**prVar2->_vptr_relation)(prVar2,type,name,sVar5 & 0xffffffff);
      return (convertable *)CONCAT44(extraout_var,iVar4);
    }
  }
  return (convertable *)0x0;
}

Assistant:

convertable *node_relation::find(type_t type, const char *name, int nlen) const
{
	if (!_curr) {
		return 0;
	}
	if (nlen < 0) nlen = name ? strlen(name) : 0;

	for (const node *c = _curr->children; c; c = c->next) {
		metatype *m;
		if (!(m = c->_meta)) {
			continue;
		}
		if (name && !c->ident.equal(name, nlen)) {
			continue;
		}
		// optional type restriction
		if (type && m->convert(type, 0) < 0) {
			continue;
		}
		return m;
	}
	return _parent ? _parent->find(type, name, nlen) : 0;
}